

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O3

void __thiscall tst_helpers_connect::rejectTwoSendersDestroyed(tst_helpers_connect *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  Object *pOVar6;
  QObject *pQVar7;
  _func_int **pp_Var8;
  QEvent *this_00;
  char *pcVar9;
  char *pcVar10;
  bool local_49;
  PromiseFromSignal<void_(Object::*)()> p;
  bool local_34 [4];
  Object *s1;
  Object *s0;
  
  pOVar6 = (Object *)operator_new(0x18);
  *(undefined8 *)pOVar6 = 0;
  *(undefined8 *)&pOVar6->field_0x8 = 0;
  *(undefined8 *)&pOVar6->m_connections = 0;
  QObject::QObject((QObject *)pOVar6,(QObject *)0x0);
  *(undefined ***)pOVar6 = &PTR_metaObject_0012acd0;
  pOVar6->m_connections = 0;
  s0 = pOVar6;
  pOVar6 = (Object *)operator_new(0x18);
  *(undefined8 *)pOVar6 = 0;
  *(undefined8 *)&pOVar6->field_0x8 = 0;
  *(undefined8 *)&pOVar6->m_connections = 0;
  QObject::QObject((QObject *)pOVar6,(QObject *)0x0);
  *(undefined ***)pOVar6 = &PTR_metaObject_0012acd0;
  pOVar6->m_connections = 0;
  s1 = pOVar6;
  pQVar7 = (QObject *)QThread::currentThread();
  if ((pQVar7 != (QObject *)0x0) &&
     (pp_Var8 = (_func_int **)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar7),
     p.super_QPromiseBase<void>._vptr_QPromiseBase = pp_Var8,
     p.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pQVar7, pp_Var8 != (_func_int **)0x0))
  {
    if ((*(int *)((long)pp_Var8 + 4) != 0) && (cVar3 = QThread::isFinished(), cVar3 == '\0')) {
      if (*(int *)((long)pp_Var8 + 4) == 0) {
        pQVar7 = (QObject *)(QThread *)0x0;
      }
      pQVar7 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar7);
      if ((pQVar7 != (QObject *)0x0) || (cVar3 = QCoreApplication::closingDown(), cVar3 == '\0')) {
        this_00 = (QEvent *)operator_new(0x20);
        QEvent::QEvent(this_00,None);
        *(undefined ***)this_00 = &PTR__Event_0012a630;
        *(Object ***)(this_00 + 0x10) = &s1;
        *(Object ***)(this_00 + 0x18) = &s0;
        QCoreApplication::postEvent(pQVar7,this_00,0);
      }
    }
    LOCK();
    *(int *)pp_Var8 = *(int *)pp_Var8 + -1;
    UNLOCK();
    if (*(int *)pp_Var8 == 0) {
      pp_Var8 = p.super_QPromiseBase<void>._vptr_QPromiseBase;
      if (p.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0) {
        pp_Var8 = (_func_int **)0x0;
      }
      operator_delete(pp_Var8);
    }
  }
  QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(int,QString_const&)>
            ((QtPromise *)&p,s0,(offset_in_Object_to_subr)s1,(Object *)Object::twoArgsSignal,0);
  QVar2 = p.super_QPromiseBase<void>.m_d;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  local_34[0] = bVar4;
  local_49 = true;
  pcVar9 = QTest::toString<bool>(local_34);
  pcVar10 = QTest::toString<bool>(&local_49);
  cVar3 = QTest::compare_helper
                    (bVar4,"Compared values are not the same",pcVar9,pcVar10,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0xd3);
  if (cVar3 != '\0') {
    local_34[0] = true;
    local_34[1] = false;
    local_34[2] = false;
    local_34[3] = false;
    iVar5 = waitForValue<int>(&p,(int *)0xffffffff,(int *)local_34);
    QTest::qCompare(iVar5,0x2a,"waitForValue(p, -1, 42)","42",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                    ,0xd4);
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012a6e0;
  LOCK();
  pQVar1 = &((QVar2.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
    (*((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
      _vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_helpers_connect::rejectTwoSendersDestroyed()
{
    auto s0 = new Object{};
    auto s1 = new Object{};

    QtPromisePrivate::qtpromise_defer([&]() {
        QObject::connect(s1, &QObject::destroyed, [&]() {
            // Let's first delete s1, then resolve s0 and make sure
            // we don't reject when the rejecter object is destroyed.
            Q_EMIT s0->noArgSignal();
        });

        s1->deleteLater();
    });

    auto p = QtPromise::connect(s0, &Object::noArgSignal, s1, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1, 42), 42);
}